

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_both.cc
# Opt level: O3

bool bssl::tls_has_unprocessed_handshake_data(SSL *ssl)

{
  buf_mem_st *pbVar1;
  bool bVar2;
  SSL3_STATE *pSVar3;
  size_t unused;
  SSLMessage msg;
  size_t sStack_38;
  SSLMessage local_30;
  
  pSVar3 = ssl->s3;
  if ((pSVar3->field_0xdc & 8) == 0) {
    local_30.raw.len = 0;
  }
  else {
    bVar2 = parse_message(ssl,&local_30,&sStack_38);
    if (!bVar2) {
      local_30.raw.len = 0;
    }
    pSVar3 = ssl->s3;
  }
  pbVar1 = (pSVar3->hs_buf)._M_t.super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl;
  if (pbVar1 == (buf_mem_st *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = local_30.raw.len < pbVar1->length;
  }
  return bVar2;
}

Assistant:

bool tls_has_unprocessed_handshake_data(const SSL *ssl) {
  size_t msg_len = 0;
  if (ssl->s3->has_message) {
    SSLMessage msg;
    size_t unused;
    if (parse_message(ssl, &msg, &unused)) {
      msg_len = CBS_len(&msg.raw);
    }
  }

  return ssl->s3->hs_buf && ssl->s3->hs_buf->length > msg_len;
}